

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_band(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  TValue *io;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (rb->tt_ == 3) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (rb->value_).n;
    auVar4 = vroundsd_avx(auVar4,auVar4,9);
    dVar3 = auVar4._0_8_;
    if (((dVar3 != (rb->value_).n) || (dVar3 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar3)) goto LAB_0014a81c;
    uVar2 = (ulong)dVar3;
  }
  else {
    if (rb->tt_ != 0x13) goto LAB_0014a81c;
    uVar2 = (rb->value_).i;
  }
  if (rc->tt_ == 3) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (rc->value_).n;
    auVar4 = vroundsd_avx(auVar5,auVar5,9);
    dVar3 = auVar4._0_8_;
    if (((dVar3 != (rc->value_).n) || (dVar3 < -9.223372036854776e+18)) ||
       (9.223372036854776e+18 <= dVar3)) goto LAB_0014a81c;
    uVar1 = (ulong)dVar3;
  }
  else {
    if (rc->tt_ != 0x13) {
LAB_0014a81c:
      luaT_trybinTM(L,rb,rc,ra,TM_BAND);
      return;
    }
    uVar1 = (rc->value_).i;
  }
  (ra->value_).i = uVar1 & uVar2;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_band(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, intop(&, ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_BAND);
  }
}